

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

ServiceDescriptor * perfetto::protos::gen::ProducerPort::NewDescriptor(void)

{
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  *this;
  ServiceDescriptor *pSVar1;
  Method local_38;
  
  pSVar1 = (ServiceDescriptor *)operator_new(0x20);
  this = &pSVar1->methods;
  (pSVar1->methods).
  super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pSVar1->methods).
  super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar1->methods).
  super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar1->service_name = "ProducerPort";
  local_38.name = "InitializeConnection";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::InitializeConnectionRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::InitializeConnectionResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::InitializeConnectionRequest,_perfetto::protos::gen::InitializeConnectionResponse,_&perfetto::protos::gen::ProducerPort::InitializeConnection>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(this,&local_38);
  local_38.name = "RegisterDataSource";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::RegisterDataSourceRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::RegisterDataSourceResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::RegisterDataSourceRequest,_perfetto::protos::gen::RegisterDataSourceResponse,_&perfetto::protos::gen::ProducerPort::RegisterDataSource>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(this,&local_38);
  local_38.name = "UnregisterDataSource";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::UnregisterDataSourceRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::UnregisterDataSourceResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::UnregisterDataSourceRequest,_perfetto::protos::gen::UnregisterDataSourceResponse,_&perfetto::protos::gen::ProducerPort::UnregisterDataSource>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(this,&local_38);
  local_38.name = "CommitData";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::CommitDataRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::CommitDataResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::CommitDataRequest,_perfetto::protos::gen::CommitDataResponse,_&perfetto::protos::gen::ProducerPort::CommitData>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(this,&local_38);
  local_38.name = "GetAsyncCommand";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::GetAsyncCommandRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::GetAsyncCommandResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::GetAsyncCommandRequest,_perfetto::protos::gen::GetAsyncCommandResponse,_&perfetto::protos::gen::ProducerPort::GetAsyncCommand>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(this,&local_38);
  local_38.name = "RegisterTraceWriter";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::RegisterTraceWriterRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::RegisterTraceWriterResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::RegisterTraceWriterRequest,_perfetto::protos::gen::RegisterTraceWriterResponse,_&perfetto::protos::gen::ProducerPort::RegisterTraceWriter>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(this,&local_38);
  local_38.name = "UnregisterTraceWriter";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::UnregisterTraceWriterRequest>
  ;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::UnregisterTraceWriterResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::UnregisterTraceWriterRequest,_perfetto::protos::gen::UnregisterTraceWriterResponse,_&perfetto::protos::gen::ProducerPort::UnregisterTraceWriter>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(this,&local_38);
  local_38.name = "NotifyDataSourceStarted";
  local_38.request_proto_decoder =
       _IPC_Decoder<perfetto::protos::gen::NotifyDataSourceStartedRequest>;
  local_38.reply_proto_decoder =
       _IPC_Decoder<perfetto::protos::gen::NotifyDataSourceStartedResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::NotifyDataSourceStartedRequest,_perfetto::protos::gen::NotifyDataSourceStartedResponse,_&perfetto::protos::gen::ProducerPort::NotifyDataSourceStarted>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(this,&local_38);
  local_38.name = "NotifyDataSourceStopped";
  local_38.request_proto_decoder =
       _IPC_Decoder<perfetto::protos::gen::NotifyDataSourceStoppedRequest>;
  local_38.reply_proto_decoder =
       _IPC_Decoder<perfetto::protos::gen::NotifyDataSourceStoppedResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::NotifyDataSourceStoppedRequest,_perfetto::protos::gen::NotifyDataSourceStoppedResponse,_&perfetto::protos::gen::ProducerPort::NotifyDataSourceStopped>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(this,&local_38);
  local_38.name = "ActivateTriggers";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ActivateTriggersRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ActivateTriggersResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::ActivateTriggersRequest,_perfetto::protos::gen::ActivateTriggersResponse,_&perfetto::protos::gen::ProducerPort::ActivateTriggers>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(this,&local_38);
  local_38.name = "Sync";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::SyncRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::SyncResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::SyncRequest,_perfetto::protos::gen::SyncResponse,_&perfetto::protos::gen::ProducerPort::Sync>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(this,&local_38);
  local_38.name = "UpdateDataSource";
  local_38.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::UpdateDataSourceRequest>;
  local_38.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::UpdateDataSourceResponse>;
  local_38.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::UpdateDataSourceRequest,_perfetto::protos::gen::UpdateDataSourceResponse,_&perfetto::protos::gen::ProducerPort::UpdateDataSource>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(this,&local_38);
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::_M_shrink_to_fit(this);
  return pSVar1;
}

Assistant:

::perfetto::ipc::ServiceDescriptor* ProducerPort::NewDescriptor() {
  auto* desc = new ::perfetto::ipc::ServiceDescriptor();
  desc->service_name = "ProducerPort";

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "InitializeConnection",
     &_IPC_Decoder<InitializeConnectionRequest>,
     &_IPC_Decoder<InitializeConnectionResponse>,
     &_IPC_Invoker<ProducerPort, InitializeConnectionRequest, InitializeConnectionResponse, &ProducerPort::InitializeConnection>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "RegisterDataSource",
     &_IPC_Decoder<RegisterDataSourceRequest>,
     &_IPC_Decoder<RegisterDataSourceResponse>,
     &_IPC_Invoker<ProducerPort, RegisterDataSourceRequest, RegisterDataSourceResponse, &ProducerPort::RegisterDataSource>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "UnregisterDataSource",
     &_IPC_Decoder<UnregisterDataSourceRequest>,
     &_IPC_Decoder<UnregisterDataSourceResponse>,
     &_IPC_Invoker<ProducerPort, UnregisterDataSourceRequest, UnregisterDataSourceResponse, &ProducerPort::UnregisterDataSource>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "CommitData",
     &_IPC_Decoder<CommitDataRequest>,
     &_IPC_Decoder<CommitDataResponse>,
     &_IPC_Invoker<ProducerPort, CommitDataRequest, CommitDataResponse, &ProducerPort::CommitData>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "GetAsyncCommand",
     &_IPC_Decoder<GetAsyncCommandRequest>,
     &_IPC_Decoder<GetAsyncCommandResponse>,
     &_IPC_Invoker<ProducerPort, GetAsyncCommandRequest, GetAsyncCommandResponse, &ProducerPort::GetAsyncCommand>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "RegisterTraceWriter",
     &_IPC_Decoder<RegisterTraceWriterRequest>,
     &_IPC_Decoder<RegisterTraceWriterResponse>,
     &_IPC_Invoker<ProducerPort, RegisterTraceWriterRequest, RegisterTraceWriterResponse, &ProducerPort::RegisterTraceWriter>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "UnregisterTraceWriter",
     &_IPC_Decoder<UnregisterTraceWriterRequest>,
     &_IPC_Decoder<UnregisterTraceWriterResponse>,
     &_IPC_Invoker<ProducerPort, UnregisterTraceWriterRequest, UnregisterTraceWriterResponse, &ProducerPort::UnregisterTraceWriter>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "NotifyDataSourceStarted",
     &_IPC_Decoder<NotifyDataSourceStartedRequest>,
     &_IPC_Decoder<NotifyDataSourceStartedResponse>,
     &_IPC_Invoker<ProducerPort, NotifyDataSourceStartedRequest, NotifyDataSourceStartedResponse, &ProducerPort::NotifyDataSourceStarted>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "NotifyDataSourceStopped",
     &_IPC_Decoder<NotifyDataSourceStoppedRequest>,
     &_IPC_Decoder<NotifyDataSourceStoppedResponse>,
     &_IPC_Invoker<ProducerPort, NotifyDataSourceStoppedRequest, NotifyDataSourceStoppedResponse, &ProducerPort::NotifyDataSourceStopped>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "ActivateTriggers",
     &_IPC_Decoder<ActivateTriggersRequest>,
     &_IPC_Decoder<ActivateTriggersResponse>,
     &_IPC_Invoker<ProducerPort, ActivateTriggersRequest, ActivateTriggersResponse, &ProducerPort::ActivateTriggers>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "Sync",
     &_IPC_Decoder<SyncRequest>,
     &_IPC_Decoder<SyncResponse>,
     &_IPC_Invoker<ProducerPort, SyncRequest, SyncResponse, &ProducerPort::Sync>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "UpdateDataSource",
     &_IPC_Decoder<UpdateDataSourceRequest>,
     &_IPC_Decoder<UpdateDataSourceResponse>,
     &_IPC_Invoker<ProducerPort, UpdateDataSourceRequest, UpdateDataSourceResponse, &ProducerPort::UpdateDataSource>});
  desc->methods.shrink_to_fit();
  return desc;
}